

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O1

void option_dump(ang_file *fff)

{
  ulong uVar1;
  ulong uVar2;
  
  file_putf(fff,"# Options\n\n");
  uVar1 = 1;
  do {
    if (angband_term[uVar1] != (term *)0x0) {
      uVar2 = 0;
      do {
        if ((window_flag_desc[uVar2] != (char *)0x0) &&
           ((window_flag[uVar1] >> ((uint)uVar2 & 0x1f) & 1) != 0)) {
          file_putf(fff,"# Window \'%s\', Flag \'%s\'\n",angband_term_name + uVar1);
          file_putf(fff,"window:%d:%d:1\n",uVar1 & 0xffffffff,uVar2 & 0xffffffff);
          file_putf(fff,"\n");
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 != 0x20);
    }
    uVar1 = uVar1 + 1;
  } while (uVar1 != 8);
  return;
}

Assistant:

void option_dump(ang_file *fff)
{
	int i, j;

	file_putf(fff, "# Options\n\n");

	/* Dump window flags */
	for (i = 1; i < ANGBAND_TERM_MAX; i++) {
		/* Require a real window */
		if (!angband_term[i]) continue;

		/* Check each flag */
		for (j = 0; j < (int)N_ELEMENTS(window_flag_desc); j++) {
			/* Require a real flag */
			if (!window_flag_desc[j]) continue;

			/* Only dump the flag if true */
			if (window_flag[i] & (((uint32_t) 1) << j)) {
				file_putf(fff, "# Window '%s', Flag '%s'\n",
						  angband_term_name[i], window_flag_desc[j]);
				file_putf(fff, "window:%d:%d:1\n", i, j);

				/* Skip a line */
				file_putf(fff, "\n");
			}
		}
	}
}